

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  int *iStart;
  BYTE *pBVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  ulong *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  bool bVar16;
  uint uVar17;
  undefined8 uVar18;
  char cVar19;
  char cVar20;
  uint uVar21;
  U32 UVar22;
  ulong *puVar23;
  size_t sVar24;
  seqDef *psVar25;
  byte bVar26;
  byte bVar28;
  byte bVar29;
  U32 UVar30;
  uint uVar31;
  ulong uVar32;
  ulong *puVar33;
  long *plVar34;
  ulong *puVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  ulong *puVar39;
  BYTE *litEnd_1;
  int *piVar40;
  ulong uVar41;
  ulong *puVar42;
  ulong *puVar43;
  BYTE *pBVar44;
  uint uVar45;
  int iVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  size_t _size;
  ulong uVar51;
  uint uVar52;
  ulong uVar53;
  uint uVar54;
  ulong *puVar55;
  U32 UVar56;
  BYTE *litEnd;
  uint uVar57;
  U32 UVar58;
  uint uVar59;
  BYTE *litEnd_6;
  int *piVar60;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *litLimit_w_6;
  BYTE *base;
  BYTE *dictBase;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 *hashSmall;
  char *_ptr;
  U32 local_144;
  byte bVar27;
  ulong uVar46;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar47 = (int)pBVar9;
  iVar50 = (int)iEnd - iVar47;
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar7 = (ms->window).dictLimit;
  uVar17 = iVar50 - uVar21;
  if (iVar50 - uVar7 <= uVar21) {
    uVar17 = uVar7;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar7;
  }
  iStart = (int *)(pBVar9 + uVar17);
  puVar5 = (ulong *)((long)src + (srcSize - 8));
  pZVar10 = ms->dictMatchState;
  uVar7 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  piVar40 = (int *)(pBVar11 + uVar7);
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  uVar45 = ((int)pBVar11 - (int)mEnd) + uVar17;
  uVar46 = (ulong)uVar45;
  pUVar12 = pZVar10->hashTable;
  pUVar13 = pZVar10->chainTable;
  uVar21 = (pZVar10->cParams).hashLog;
  uVar57 = (pZVar10->cParams).chainLog;
  iVar48 = ((int)src - ((int)iStart + (int)piVar40)) + (int)mEnd;
  uVar8 = (ms->cParams).minMatch;
  pUVar14 = ms->hashTable;
  pUVar15 = ms->chainTable;
  iVar50 = ms->prefetchCDictTables;
  local_144 = *rep;
  UVar58 = rep[1];
  bVar26 = (byte)uVar21;
  bVar27 = (byte)uVar57;
  cVar19 = (char)(ms->cParams).hashLog;
  cVar20 = (char)(ms->cParams).chainLog;
  if (uVar8 == 5) {
    if (iVar50 != 0) {
      if (uVar21 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar57 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar48 == 0));
    if (puVar39 < puVar5) {
      bVar28 = 0x40 - cVar19;
      bVar29 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar23 = iEnd + -4;
LAB_0039bea1:
      uVar32 = *puVar39;
      uVar51 = uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
      uVar53 = uVar32 * -0x30e4432345000000 >> (bVar29 & 0x3f);
      uVar49 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
      uVar36 = uVar32 * -0x30e4432345000000 >> (0x38 - bVar27 & 0x3f);
      uVar21 = pUVar12[uVar49 >> 8];
      uVar57 = pUVar13[uVar36 >> 8];
      iVar50 = (int)puVar39;
      UVar56 = iVar50 - iVar47;
      uVar8 = pUVar14[uVar51];
      uVar41 = (ulong)uVar8;
      UVar30 = UVar56 + 1;
      uVar31 = UVar30 - local_144;
      piVar60 = (int *)(pBVar9 + uVar31);
      if (uVar31 < uVar17) {
        piVar60 = (int *)(pBVar11 + (uVar31 - uVar45));
      }
      uVar54 = pUVar15[uVar53];
      pUVar15[uVar53] = UVar56;
      pUVar14[uVar51] = UVar56;
      if ((2 < (uVar17 - 1) - uVar31) && (*piVar60 == *(int *)((long)puVar39 + 1))) {
        puVar35 = (ulong *)((long)puVar39 + 1);
        puVar33 = iEnd;
        if (uVar31 < uVar17) {
          puVar33 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar60 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar33,(BYTE *)iStart);
        uVar32 = (long)puVar35 - (long)src;
        puVar39 = (ulong *)seqStore->lit;
        if (puVar23 < puVar35) {
          ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
LAB_0039bff8:
          seqStore->lit = seqStore->lit + uVar32;
          psVar25 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar41 = *(ulong *)((long)src + 8);
          *puVar39 = *src;
          puVar39[1] = uVar41;
          pBVar44 = seqStore->lit;
          if (0x10 < uVar32) {
            uVar41 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar44 + 0x18) = uVar41;
            if (0x20 < (long)uVar32) {
              lVar37 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar18 = puVar6[1];
                pBVar4 = pBVar44 + lVar37 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar18;
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar18 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (pBVar4 + 0x20 < pBVar44 + uVar32);
            }
            goto LAB_0039bff8;
          }
          seqStore->lit = pBVar44 + uVar32;
          psVar25 = seqStore->sequences;
        }
        lVar37 = sVar24 + 4;
        psVar25->litLength = (U16)uVar32;
        psVar25->offBase = 1;
        uVar32 = sVar24 + 1;
        UVar30 = local_144;
        goto joined_r0x0039c48b;
      }
      puVar35 = puVar39;
      if (uVar17 < uVar8) {
        puVar33 = (ulong *)(pBVar9 + uVar41);
        if (*puVar33 != uVar32) goto LAB_0039c167;
        puVar43 = puVar39 + 1;
        puVar42 = puVar33 + 1;
        puVar55 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar42 == *puVar43) {
            lVar37 = 0;
            do {
              puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x10);
              if (puVar1 <= puVar42) {
                puVar42 = (ulong *)(pBVar9 + lVar37 + uVar41 + 0x10);
                puVar55 = (ulong *)((long)puVar39 + lVar37 + 0x10);
                goto LAB_0039c522;
              }
              lVar38 = lVar37 + uVar41 + 0x10;
              uVar32 = *puVar42;
              lVar37 = lVar37 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar32);
            uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar38);
            uVar36 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar32 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar36 = *puVar43 ^ *puVar42;
            uVar32 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0039c522:
          if ((puVar55 < puVar2) && ((int)*puVar42 == (int)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 4);
            puVar42 = (ulong *)((long)puVar42 + 4);
          }
          if ((puVar55 < puVar3) && ((short)*puVar42 == (short)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 2);
            puVar42 = (ulong *)((long)puVar42 + 2);
          }
          if (puVar55 < iEnd) {
            puVar55 = (ulong *)((long)puVar55 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar55));
          }
          uVar32 = (long)puVar55 - (long)puVar43;
        }
        lVar37 = uVar32 + 8;
        UVar30 = iVar50 - (int)puVar33;
        if (puVar39 <= src) goto LAB_0039c754;
        piVar60 = (int *)(pBVar9 + (uVar41 - 1));
        puVar39 = (ulong *)((long)puVar39 + -1);
        do {
          if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039c749;
          lVar37 = lVar37 + 1;
          puVar35 = (ulong *)((long)puVar39 + -1);
        } while ((src < puVar39) &&
                (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1), puVar39 = puVar35
                , bVar16));
        goto LAB_0039c744;
      }
      if ((char)uVar49 == (char)uVar21) {
        uVar21 = uVar21 >> 8;
        if ((uVar21 <= uVar7) || (*(ulong *)(pBVar11 + uVar21) != uVar32)) goto LAB_0039c167;
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)(puVar39 + 1),(BYTE *)((long)(pBVar11 + uVar21) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar37 = sVar24 + 8;
        UVar30 = UVar56 - (uVar21 + uVar45);
        if (src < puVar39) {
          piVar60 = (int *)(pBVar11 + ((ulong)uVar21 - 1));
          puVar39 = (ulong *)((long)puVar39 + -1);
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039c749;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = piVar40 < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039c744;
        }
        goto LAB_0039c754;
      }
LAB_0039c167:
      if (uVar17 < uVar54) {
        piVar60 = (int *)(pBVar9 + uVar54);
        if (*piVar60 != (int)*puVar39) goto LAB_0039c2a4;
LAB_0039c18a:
        lVar37 = *(long *)((long)puVar39 + 1);
        uVar36 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f);
        uVar41 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (0x38 - bVar26 & 0x3f);
        puVar35 = (ulong *)((long)puVar39 + 1);
        uVar21 = pUVar14[uVar36];
        uVar32 = (ulong)uVar21;
        uVar57 = pUVar12[uVar41 >> 8];
        pUVar14[uVar36] = UVar30;
        if (uVar17 < uVar21) {
          plVar34 = (long *)(pBVar9 + uVar32);
          if (*plVar34 != lVar37) goto LAB_0039c3cf;
          puVar33 = (ulong *)((long)puVar39 + 9);
          puVar43 = (ulong *)(plVar34 + 1);
          puVar42 = puVar33;
          if (puVar33 < puVar1) {
            if (*puVar43 == *puVar33) {
              lVar37 = 0;
              do {
                puVar43 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                if (puVar1 <= puVar43) {
                  puVar43 = (ulong *)(pBVar9 + lVar37 + uVar32 + 0x10);
                  puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                  goto LAB_0039c6b8;
                }
                lVar38 = lVar37 + uVar32 + 0x10;
                uVar41 = *puVar43;
                lVar37 = lVar37 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar41);
              uVar41 = uVar41 ^ *(ulong *)(pBVar9 + lVar38);
              uVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar41 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar36 = *puVar33 ^ *puVar43;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = uVar41 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0039c6b8:
            if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar43 = (ulong *)((long)puVar43 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar43 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar43 = (ulong *)((long)puVar43 + 2);
            }
            if (puVar42 < iEnd) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar33;
          }
          lVar37 = uVar41 + 8;
          UVar30 = (int)puVar35 - (int)plVar34;
          if (puVar35 <= src) goto LAB_0039c754;
          piVar60 = (int *)(pBVar9 + (uVar32 - 1));
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039c749;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039c744;
        }
        if ((char)uVar41 == (char)uVar57) {
          uVar57 = uVar57 >> 8;
          if ((uVar57 <= uVar7) || (*(long *)(pBVar11 + uVar57) != lVar37)) goto LAB_0039c3cf;
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 9),(BYTE *)((long)(pBVar11 + uVar57) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar37 = sVar24 + 8;
          UVar30 = UVar30 - (uVar45 + uVar57);
          if (src < puVar35) {
            piVar60 = (int *)(pBVar11 + ((ulong)uVar57 - 1));
            do {
              if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039c749;
              lVar37 = lVar37 + 1;
              puVar35 = (ulong *)((long)puVar39 + -1);
            } while ((src < puVar39) &&
                    (bVar16 = piVar40 < piVar60, puVar39 = puVar35,
                    piVar60 = (int *)((long)piVar60 + -1), bVar16));
            goto LAB_0039c744;
          }
        }
        else {
LAB_0039c3cf:
          puVar35 = (ulong *)((long)puVar39 + 4);
          puVar33 = (ulong *)(piVar60 + 1);
          if (uVar54 < uVar17) {
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)puVar35,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            lVar37 = sVar24 + 4;
            UVar30 = UVar56 - uVar54;
            puVar35 = puVar39;
            if ((src < puVar39) && (piVar40 < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039c749;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, piVar40 < piVar60));
              goto LAB_0039c744;
            }
          }
          else {
            puVar43 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar33 == *puVar35) {
                lVar37 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)((long)piVar60 + lVar37 + 0xc);
                    puVar43 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                    goto LAB_0039c608;
                  }
                  uVar32 = *(ulong *)((long)piVar60 + lVar37 + 0xc);
                  uVar41 = *puVar33;
                  lVar37 = lVar37 + 8;
                } while (uVar32 == uVar41);
                uVar41 = uVar41 ^ uVar32;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar37;
              }
              else {
                uVar41 = *puVar35 ^ *puVar33;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0039c608:
              if ((puVar43 < puVar2) && ((int)*puVar33 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar33 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar43 < iEnd) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar43));
              }
              uVar32 = (long)puVar43 - (long)puVar35;
            }
            lVar37 = uVar32 + 4;
            UVar30 = iVar50 - (int)piVar60;
            puVar35 = puVar39;
            if ((src < puVar39) && (iStart < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039c749;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, iStart < piVar60));
LAB_0039c744:
              puVar35 = (ulong *)((long)puVar35 + 1);
            }
          }
        }
        goto LAB_0039c754;
      }
      if ((char)uVar36 == (char)uVar57) {
        uVar57 = uVar57 >> 8;
        if ((uVar7 < uVar57) && (*(int *)(pBVar11 + uVar57) == (int)*puVar39)) {
          uVar54 = uVar57 + uVar45;
          piVar60 = (int *)(pBVar11 + uVar57);
          goto LAB_0039c18a;
        }
      }
LAB_0039c2a4:
      puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      goto LAB_0039ca26;
    }
  }
  else if (uVar8 == 6) {
    if (iVar50 != 0) {
      if (uVar21 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar57 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar48 == 0));
    if (puVar39 < puVar5) {
      bVar28 = 0x40 - cVar19;
      bVar29 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar23 = iEnd + -4;
LAB_0039b1f2:
      uVar32 = *puVar39;
      uVar51 = uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
      uVar53 = uVar32 * -0x30e4432340650000 >> (bVar29 & 0x3f);
      uVar49 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
      uVar36 = uVar32 * -0x30e4432340650000 >> (0x38 - bVar27 & 0x3f);
      uVar21 = pUVar12[uVar49 >> 8];
      uVar57 = pUVar13[uVar36 >> 8];
      iVar50 = (int)puVar39;
      UVar56 = iVar50 - iVar47;
      uVar8 = pUVar14[uVar51];
      uVar41 = (ulong)uVar8;
      UVar30 = UVar56 + 1;
      uVar31 = UVar30 - local_144;
      piVar60 = (int *)(pBVar9 + uVar31);
      if (uVar31 < uVar17) {
        piVar60 = (int *)(pBVar11 + (uVar31 - uVar45));
      }
      uVar54 = pUVar15[uVar53];
      pUVar15[uVar53] = UVar56;
      pUVar14[uVar51] = UVar56;
      if ((2 < (uVar17 - 1) - uVar31) && (*piVar60 == *(int *)((long)puVar39 + 1))) {
        puVar35 = (ulong *)((long)puVar39 + 1);
        puVar33 = iEnd;
        if (uVar31 < uVar17) {
          puVar33 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar60 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar33,(BYTE *)iStart);
        uVar32 = (long)puVar35 - (long)src;
        puVar39 = (ulong *)seqStore->lit;
        if (puVar23 < puVar35) {
          ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
LAB_0039b349:
          seqStore->lit = seqStore->lit + uVar32;
          psVar25 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar41 = *(ulong *)((long)src + 8);
          *puVar39 = *src;
          puVar39[1] = uVar41;
          pBVar44 = seqStore->lit;
          if (0x10 < uVar32) {
            uVar41 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar44 + 0x18) = uVar41;
            if (0x20 < (long)uVar32) {
              lVar37 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar18 = puVar6[1];
                pBVar4 = pBVar44 + lVar37 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar18;
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar18 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (pBVar4 + 0x20 < pBVar44 + uVar32);
            }
            goto LAB_0039b349;
          }
          seqStore->lit = pBVar44 + uVar32;
          psVar25 = seqStore->sequences;
        }
        lVar37 = sVar24 + 4;
        psVar25->litLength = (U16)uVar32;
        psVar25->offBase = 1;
        uVar32 = sVar24 + 1;
        UVar30 = local_144;
        goto joined_r0x0039b7dc;
      }
      puVar35 = puVar39;
      if (uVar17 < uVar8) {
        puVar33 = (ulong *)(pBVar9 + uVar41);
        if (*puVar33 != uVar32) goto LAB_0039b4b8;
        puVar43 = puVar39 + 1;
        puVar42 = puVar33 + 1;
        puVar55 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar42 == *puVar43) {
            lVar37 = 0;
            do {
              puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x10);
              if (puVar1 <= puVar42) {
                puVar42 = (ulong *)(pBVar9 + lVar37 + uVar41 + 0x10);
                puVar55 = (ulong *)((long)puVar39 + lVar37 + 0x10);
                goto LAB_0039b869;
              }
              lVar38 = lVar37 + uVar41 + 0x10;
              uVar32 = *puVar42;
              lVar37 = lVar37 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar32);
            uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar38);
            uVar36 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar32 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar36 = *puVar43 ^ *puVar42;
            uVar32 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0039b869:
          if ((puVar55 < puVar2) && ((int)*puVar42 == (int)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 4);
            puVar42 = (ulong *)((long)puVar42 + 4);
          }
          if ((puVar55 < puVar3) && ((short)*puVar42 == (short)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 2);
            puVar42 = (ulong *)((long)puVar42 + 2);
          }
          if (puVar55 < iEnd) {
            puVar55 = (ulong *)((long)puVar55 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar55));
          }
          uVar32 = (long)puVar55 - (long)puVar43;
        }
        lVar37 = uVar32 + 8;
        UVar30 = iVar50 - (int)puVar33;
        if (puVar39 <= src) goto LAB_0039ba8f;
        piVar60 = (int *)(pBVar9 + (uVar41 - 1));
        puVar39 = (ulong *)((long)puVar39 + -1);
        do {
          if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039ba89;
          lVar37 = lVar37 + 1;
          puVar35 = (ulong *)((long)puVar39 + -1);
        } while ((src < puVar39) &&
                (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1), puVar39 = puVar35
                , bVar16));
        goto LAB_0039ba84;
      }
      if ((char)uVar49 == (char)uVar21) {
        uVar21 = uVar21 >> 8;
        if ((uVar21 <= uVar7) || (*(ulong *)(pBVar11 + uVar21) != uVar32)) goto LAB_0039b4b8;
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)(puVar39 + 1),(BYTE *)((long)(pBVar11 + uVar21) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar37 = sVar24 + 8;
        UVar30 = UVar56 - (uVar21 + uVar45);
        if (src < puVar39) {
          piVar60 = (int *)(pBVar11 + ((ulong)uVar21 - 1));
          puVar39 = (ulong *)((long)puVar39 + -1);
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039ba89;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = piVar40 < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039ba84;
        }
        goto LAB_0039ba8f;
      }
LAB_0039b4b8:
      if (uVar17 < uVar54) {
        piVar60 = (int *)(pBVar9 + uVar54);
        if (*piVar60 != (int)*puVar39) goto LAB_0039b5f5;
LAB_0039b4db:
        lVar37 = *(long *)((long)puVar39 + 1);
        uVar36 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f);
        uVar41 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (0x38 - bVar26 & 0x3f);
        puVar35 = (ulong *)((long)puVar39 + 1);
        uVar21 = pUVar14[uVar36];
        uVar32 = (ulong)uVar21;
        uVar57 = pUVar12[uVar41 >> 8];
        pUVar14[uVar36] = UVar30;
        if (uVar17 < uVar21) {
          plVar34 = (long *)(pBVar9 + uVar32);
          if (*plVar34 != lVar37) goto LAB_0039b720;
          puVar33 = (ulong *)((long)puVar39 + 9);
          puVar43 = (ulong *)(plVar34 + 1);
          puVar42 = puVar33;
          if (puVar33 < puVar1) {
            if (*puVar43 == *puVar33) {
              lVar37 = 0;
              do {
                puVar43 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                if (puVar1 <= puVar43) {
                  puVar43 = (ulong *)(pBVar9 + lVar37 + uVar32 + 0x10);
                  puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                  goto LAB_0039b9f8;
                }
                lVar38 = lVar37 + uVar32 + 0x10;
                uVar41 = *puVar43;
                lVar37 = lVar37 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar41);
              uVar41 = uVar41 ^ *(ulong *)(pBVar9 + lVar38);
              uVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar41 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar36 = *puVar33 ^ *puVar43;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = uVar41 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0039b9f8:
            if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar43 = (ulong *)((long)puVar43 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar43 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar43 = (ulong *)((long)puVar43 + 2);
            }
            if (puVar42 < iEnd) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar33;
          }
          lVar37 = uVar41 + 8;
          UVar30 = (int)puVar35 - (int)plVar34;
          if (puVar35 <= src) goto LAB_0039ba8f;
          piVar60 = (int *)(pBVar9 + (uVar32 - 1));
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039ba89;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039ba84;
        }
        if ((char)uVar41 == (char)uVar57) {
          uVar57 = uVar57 >> 8;
          if ((uVar57 <= uVar7) || (*(long *)(pBVar11 + uVar57) != lVar37)) goto LAB_0039b720;
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 9),(BYTE *)((long)(pBVar11 + uVar57) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar37 = sVar24 + 8;
          UVar30 = UVar30 - (uVar45 + uVar57);
          if (src < puVar35) {
            piVar60 = (int *)(pBVar11 + ((ulong)uVar57 - 1));
            do {
              if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039ba89;
              lVar37 = lVar37 + 1;
              puVar35 = (ulong *)((long)puVar39 + -1);
            } while ((src < puVar39) &&
                    (bVar16 = piVar40 < piVar60, puVar39 = puVar35,
                    piVar60 = (int *)((long)piVar60 + -1), bVar16));
            goto LAB_0039ba84;
          }
        }
        else {
LAB_0039b720:
          puVar35 = (ulong *)((long)puVar39 + 4);
          puVar33 = (ulong *)(piVar60 + 1);
          if (uVar54 < uVar17) {
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)puVar35,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            lVar37 = sVar24 + 4;
            UVar30 = UVar56 - uVar54;
            puVar35 = puVar39;
            if ((src < puVar39) && (piVar40 < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039ba89;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, piVar40 < piVar60));
              goto LAB_0039ba84;
            }
          }
          else {
            puVar43 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar33 == *puVar35) {
                lVar37 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)((long)piVar60 + lVar37 + 0xc);
                    puVar43 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                    goto LAB_0039b948;
                  }
                  uVar32 = *(ulong *)((long)piVar60 + lVar37 + 0xc);
                  uVar41 = *puVar33;
                  lVar37 = lVar37 + 8;
                } while (uVar32 == uVar41);
                uVar41 = uVar41 ^ uVar32;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar37;
              }
              else {
                uVar41 = *puVar35 ^ *puVar33;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0039b948:
              if ((puVar43 < puVar2) && ((int)*puVar33 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar33 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar43 < iEnd) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar43));
              }
              uVar32 = (long)puVar43 - (long)puVar35;
            }
            lVar37 = uVar32 + 4;
            UVar30 = iVar50 - (int)piVar60;
            puVar35 = puVar39;
            if ((src < puVar39) && (iStart < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039ba89;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, iStart < piVar60));
LAB_0039ba84:
              puVar35 = (ulong *)((long)puVar35 + 1);
            }
          }
        }
        goto LAB_0039ba8f;
      }
      if ((char)uVar36 == (char)uVar57) {
        uVar57 = uVar57 >> 8;
        if ((uVar7 < uVar57) && (*(int *)(pBVar11 + uVar57) == (int)*puVar39)) {
          uVar54 = uVar57 + uVar45;
          piVar60 = (int *)(pBVar11 + uVar57);
          goto LAB_0039b4db;
        }
      }
LAB_0039b5f5:
      puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      goto LAB_0039bd67;
    }
  }
  else if (uVar8 == 7) {
    if (iVar50 != 0) {
      if (uVar21 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar57 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar48 == 0));
    if (puVar39 < puVar5) {
      bVar28 = 0x40 - cVar19;
      bVar29 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
LAB_0039a541:
      uVar32 = *puVar39;
      uVar51 = uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
      uVar53 = uVar32 * -0x30e44323405a9d00 >> (bVar29 & 0x3f);
      uVar49 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
      uVar36 = uVar32 * -0x30e44323405a9d00 >> (0x38 - bVar27 & 0x3f);
      uVar21 = pUVar12[uVar49 >> 8];
      uVar57 = pUVar13[uVar36 >> 8];
      iVar50 = (int)puVar39;
      UVar56 = iVar50 - iVar47;
      uVar8 = pUVar14[uVar51];
      uVar41 = (ulong)uVar8;
      UVar30 = UVar56 + 1;
      uVar31 = UVar30 - local_144;
      piVar60 = (int *)(pBVar9 + uVar31);
      if (uVar31 < uVar17) {
        piVar60 = (int *)(pBVar11 + (uVar31 - uVar45));
      }
      uVar54 = pUVar15[uVar53];
      pUVar15[uVar53] = UVar56;
      pUVar14[uVar51] = UVar56;
      if ((2 < (uVar17 - 1) - uVar31) && (*piVar60 == *(int *)((long)puVar39 + 1))) {
        puVar35 = (ulong *)((long)puVar39 + 1);
        puVar33 = iEnd;
        if (uVar31 < uVar17) {
          puVar33 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar60 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar33,(BYTE *)iStart);
        uVar32 = (long)puVar35 - (long)src;
        puVar39 = (ulong *)seqStore->lit;
        if (puVar23 < puVar35) {
          ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
LAB_0039a698:
          seqStore->lit = seqStore->lit + uVar32;
          psVar25 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar41 = *(ulong *)((long)src + 8);
          *puVar39 = *src;
          puVar39[1] = uVar41;
          pBVar44 = seqStore->lit;
          if (0x10 < uVar32) {
            uVar41 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar44 + 0x18) = uVar41;
            if (0x20 < (long)uVar32) {
              lVar37 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar18 = puVar6[1];
                pBVar4 = pBVar44 + lVar37 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar18;
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar18 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (pBVar4 + 0x20 < pBVar44 + uVar32);
            }
            goto LAB_0039a698;
          }
          seqStore->lit = pBVar44 + uVar32;
          psVar25 = seqStore->sequences;
        }
        lVar37 = sVar24 + 4;
        psVar25->litLength = (U16)uVar32;
        psVar25->offBase = 1;
        uVar32 = sVar24 + 1;
        UVar30 = local_144;
        goto joined_r0x0039ab2b;
      }
      puVar35 = puVar39;
      if (uVar17 < uVar8) {
        puVar33 = (ulong *)(pBVar9 + uVar41);
        if (*puVar33 != uVar32) goto LAB_0039a807;
        puVar43 = puVar39 + 1;
        puVar42 = puVar33 + 1;
        puVar55 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar42 == *puVar43) {
            lVar37 = 0;
            do {
              puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x10);
              if (puVar1 <= puVar42) {
                puVar42 = (ulong *)(pBVar9 + lVar37 + uVar41 + 0x10);
                puVar55 = (ulong *)((long)puVar39 + lVar37 + 0x10);
                goto LAB_0039abb8;
              }
              lVar38 = lVar37 + uVar41 + 0x10;
              uVar32 = *puVar42;
              lVar37 = lVar37 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar32);
            uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar38);
            uVar36 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar32 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar36 = *puVar43 ^ *puVar42;
            uVar32 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0039abb8:
          if ((puVar55 < puVar2) && ((int)*puVar42 == (int)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 4);
            puVar42 = (ulong *)((long)puVar42 + 4);
          }
          if ((puVar55 < puVar3) && ((short)*puVar42 == (short)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 2);
            puVar42 = (ulong *)((long)puVar42 + 2);
          }
          if (puVar55 < iEnd) {
            puVar55 = (ulong *)((long)puVar55 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar55));
          }
          uVar32 = (long)puVar55 - (long)puVar43;
        }
        lVar37 = uVar32 + 8;
        UVar30 = iVar50 - (int)puVar33;
        if (puVar39 <= src) goto LAB_0039adde;
        piVar60 = (int *)(pBVar9 + (uVar41 - 1));
        puVar39 = (ulong *)((long)puVar39 + -1);
        do {
          if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039add8;
          lVar37 = lVar37 + 1;
          puVar35 = (ulong *)((long)puVar39 + -1);
        } while ((src < puVar39) &&
                (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1), puVar39 = puVar35
                , bVar16));
        goto LAB_0039add3;
      }
      if ((char)uVar49 == (char)uVar21) {
        uVar21 = uVar21 >> 8;
        if ((uVar21 <= uVar7) || (*(ulong *)(pBVar11 + uVar21) != uVar32)) goto LAB_0039a807;
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)(puVar39 + 1),(BYTE *)((long)(pBVar11 + uVar21) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar37 = sVar24 + 8;
        UVar30 = UVar56 - (uVar21 + uVar45);
        if (src < puVar39) {
          piVar60 = (int *)(pBVar11 + ((ulong)uVar21 - 1));
          puVar39 = (ulong *)((long)puVar39 + -1);
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039add8;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = piVar40 < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039add3;
        }
        goto LAB_0039adde;
      }
LAB_0039a807:
      if (uVar17 < uVar54) {
        piVar60 = (int *)(pBVar9 + uVar54);
        if (*piVar60 != (int)*puVar39) goto LAB_0039a944;
LAB_0039a82a:
        lVar37 = *(long *)((long)puVar39 + 1);
        uVar36 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f);
        uVar41 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (0x38 - bVar26 & 0x3f);
        puVar35 = (ulong *)((long)puVar39 + 1);
        uVar21 = pUVar14[uVar36];
        uVar32 = (ulong)uVar21;
        uVar57 = pUVar12[uVar41 >> 8];
        pUVar14[uVar36] = UVar30;
        if (uVar17 < uVar21) {
          plVar34 = (long *)(pBVar9 + uVar32);
          if (*plVar34 != lVar37) goto LAB_0039aa6f;
          puVar33 = (ulong *)((long)puVar39 + 9);
          puVar43 = (ulong *)(plVar34 + 1);
          puVar42 = puVar33;
          if (puVar33 < puVar1) {
            if (*puVar43 == *puVar33) {
              lVar37 = 0;
              do {
                puVar43 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                if (puVar1 <= puVar43) {
                  puVar43 = (ulong *)(pBVar9 + lVar37 + uVar32 + 0x10);
                  puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                  goto LAB_0039ad47;
                }
                lVar38 = lVar37 + uVar32 + 0x10;
                uVar41 = *puVar43;
                lVar37 = lVar37 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar41);
              uVar41 = uVar41 ^ *(ulong *)(pBVar9 + lVar38);
              uVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar41 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar36 = *puVar33 ^ *puVar43;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = uVar41 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0039ad47:
            if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar43 = (ulong *)((long)puVar43 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar43 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar43 = (ulong *)((long)puVar43 + 2);
            }
            if (puVar42 < iEnd) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar33;
          }
          lVar37 = uVar41 + 8;
          UVar30 = (int)puVar35 - (int)plVar34;
          if (puVar35 <= src) goto LAB_0039adde;
          piVar60 = (int *)(pBVar9 + (uVar32 - 1));
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039add8;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039add3;
        }
        if ((char)uVar41 == (char)uVar57) {
          uVar57 = uVar57 >> 8;
          if ((uVar57 <= uVar7) || (*(long *)(pBVar11 + uVar57) != lVar37)) goto LAB_0039aa6f;
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 9),(BYTE *)((long)(pBVar11 + uVar57) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar37 = sVar24 + 8;
          UVar30 = UVar30 - (uVar45 + uVar57);
          if (src < puVar35) {
            piVar60 = (int *)(pBVar11 + ((ulong)uVar57 - 1));
            do {
              if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039add8;
              lVar37 = lVar37 + 1;
              puVar35 = (ulong *)((long)puVar39 + -1);
            } while ((src < puVar39) &&
                    (bVar16 = piVar40 < piVar60, puVar39 = puVar35,
                    piVar60 = (int *)((long)piVar60 + -1), bVar16));
            goto LAB_0039add3;
          }
        }
        else {
LAB_0039aa6f:
          puVar35 = (ulong *)((long)puVar39 + 4);
          puVar33 = (ulong *)(piVar60 + 1);
          if (uVar54 < uVar17) {
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)puVar35,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            lVar37 = sVar24 + 4;
            UVar30 = UVar56 - uVar54;
            puVar35 = puVar39;
            if ((src < puVar39) && (piVar40 < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039add8;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, piVar40 < piVar60));
              goto LAB_0039add3;
            }
          }
          else {
            puVar43 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar33 == *puVar35) {
                lVar37 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)((long)piVar60 + lVar37 + 0xc);
                    puVar43 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                    goto LAB_0039ac97;
                  }
                  uVar32 = *(ulong *)((long)piVar60 + lVar37 + 0xc);
                  uVar41 = *puVar33;
                  lVar37 = lVar37 + 8;
                } while (uVar32 == uVar41);
                uVar41 = uVar41 ^ uVar32;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar37;
              }
              else {
                uVar41 = *puVar35 ^ *puVar33;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0039ac97:
              if ((puVar43 < puVar2) && ((int)*puVar33 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar33 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar43 < iEnd) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar43));
              }
              uVar32 = (long)puVar43 - (long)puVar35;
            }
            lVar37 = uVar32 + 4;
            UVar30 = iVar50 - (int)piVar60;
            puVar35 = puVar39;
            if ((src < puVar39) && (iStart < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039add8;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, iStart < piVar60));
LAB_0039add3:
              puVar35 = (ulong *)((long)puVar35 + 1);
            }
          }
        }
        goto LAB_0039adde;
      }
      if ((char)uVar36 == (char)uVar57) {
        uVar57 = uVar57 >> 8;
        if ((uVar7 < uVar57) && (*(int *)(pBVar11 + uVar57) == (int)*puVar39)) {
          uVar54 = uVar57 + uVar45;
          piVar60 = (int *)(pBVar11 + uVar57);
          goto LAB_0039a82a;
        }
      }
LAB_0039a944:
      puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      goto LAB_0039b0b6;
    }
  }
  else {
    if (iVar50 != 0) {
      if (uVar21 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar57 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    puVar39 = (ulong *)((long)src + (ulong)(iVar48 == 0));
    if (puVar39 < puVar5) {
      bVar28 = 0x40 - cVar19;
      bVar29 = 0x20 - cVar20;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar23 = iEnd + -4;
LAB_0039cb5c:
      uVar32 = *puVar39;
      uVar49 = uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
      uVar54 = (int)uVar32 * -0x61c8864f;
      uVar52 = uVar54 >> (bVar29 & 0x1f);
      uVar36 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
      uVar54 = uVar54 >> (0x18 - bVar27 & 0x1f);
      uVar21 = pUVar12[uVar36 >> 8];
      uVar57 = pUVar13[uVar54 >> 8];
      iVar50 = (int)puVar39;
      UVar56 = iVar50 - iVar47;
      uVar8 = pUVar14[uVar49];
      uVar41 = (ulong)uVar8;
      UVar30 = UVar56 + 1;
      uVar31 = UVar30 - local_144;
      piVar60 = (int *)(pBVar9 + uVar31);
      if (uVar31 < uVar17) {
        piVar60 = (int *)(pBVar11 + (uVar31 - uVar45));
      }
      uVar59 = pUVar15[uVar52];
      pUVar15[uVar52] = UVar56;
      pUVar14[uVar49] = UVar56;
      if ((2 < (uVar17 - 1) - uVar31) && (*piVar60 == *(int *)((long)puVar39 + 1))) {
        puVar35 = (ulong *)((long)puVar39 + 1);
        puVar33 = iEnd;
        if (uVar31 < uVar17) {
          puVar33 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar60 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar33,(BYTE *)iStart);
        uVar32 = (long)puVar35 - (long)src;
        puVar39 = (ulong *)seqStore->lit;
        if (puVar23 < puVar35) {
          ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
LAB_0039cca3:
          seqStore->lit = seqStore->lit + uVar32;
          psVar25 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar41 = *(ulong *)((long)src + 8);
          *puVar39 = *src;
          puVar39[1] = uVar41;
          pBVar44 = seqStore->lit;
          if (0x10 < uVar32) {
            uVar41 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar44 + 0x18) = uVar41;
            if (0x20 < (long)uVar32) {
              lVar37 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar18 = puVar6[1];
                pBVar4 = pBVar44 + lVar37 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar18;
                puVar6 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar18 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (pBVar4 + 0x20 < pBVar44 + uVar32);
            }
            goto LAB_0039cca3;
          }
          seqStore->lit = pBVar44 + uVar32;
          psVar25 = seqStore->sequences;
        }
        lVar37 = sVar24 + 4;
        psVar25->litLength = (U16)uVar32;
        psVar25->offBase = 1;
        uVar32 = sVar24 + 1;
        UVar30 = local_144;
        goto joined_r0x0039d14c;
      }
      puVar35 = puVar39;
      if (uVar17 < uVar8) {
        puVar33 = (ulong *)(pBVar9 + uVar41);
        if (*puVar33 != uVar32) goto LAB_0039ce17;
        puVar43 = puVar39 + 1;
        puVar42 = puVar33 + 1;
        puVar55 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar42 == *puVar43) {
            lVar37 = 0;
            do {
              puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x10);
              if (puVar1 <= puVar42) {
                puVar42 = (ulong *)(pBVar9 + lVar37 + uVar41 + 0x10);
                puVar55 = (ulong *)((long)puVar39 + lVar37 + 0x10);
                goto LAB_0039d1dc;
              }
              lVar38 = lVar37 + uVar41 + 0x10;
              uVar32 = *puVar42;
              lVar37 = lVar37 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar32);
            uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar38);
            uVar36 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar32 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar36 = *puVar43 ^ *puVar42;
            uVar32 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0039d1dc:
          if ((puVar55 < puVar2) && ((int)*puVar42 == (int)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 4);
            puVar42 = (ulong *)((long)puVar42 + 4);
          }
          if ((puVar55 < puVar3) && ((short)*puVar42 == (short)*puVar55)) {
            puVar55 = (ulong *)((long)puVar55 + 2);
            puVar42 = (ulong *)((long)puVar42 + 2);
          }
          if (puVar55 < iEnd) {
            puVar55 = (ulong *)((long)puVar55 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar55));
          }
          uVar32 = (long)puVar55 - (long)puVar43;
        }
        lVar37 = uVar32 + 8;
        UVar30 = iVar50 - (int)puVar33;
        if (puVar39 <= src) goto LAB_0039d3fe;
        piVar60 = (int *)(pBVar9 + (uVar41 - 1));
        puVar39 = (ulong *)((long)puVar39 + -1);
        do {
          if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039d3f8;
          lVar37 = lVar37 + 1;
          puVar35 = (ulong *)((long)puVar39 + -1);
        } while ((src < puVar39) &&
                (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1), puVar39 = puVar35
                , bVar16));
        goto LAB_0039d3f3;
      }
      if ((char)uVar36 == (char)uVar21) {
        uVar21 = uVar21 >> 8;
        if ((uVar21 <= uVar7) || (*(ulong *)(pBVar11 + uVar21) != uVar32)) goto LAB_0039ce17;
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)(puVar39 + 1),(BYTE *)((long)(pBVar11 + uVar21) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar37 = sVar24 + 8;
        UVar30 = UVar56 - (uVar21 + uVar45);
        if (src < puVar39) {
          piVar60 = (int *)(pBVar11 + ((ulong)uVar21 - 1));
          puVar39 = (ulong *)((long)puVar39 + -1);
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039d3f8;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = piVar40 < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039d3f3;
        }
        goto LAB_0039d3fe;
      }
LAB_0039ce17:
      if (uVar17 < uVar59) {
        piVar60 = (int *)(pBVar9 + uVar59);
        if (*piVar60 != (int)*puVar39) goto LAB_0039cf5c;
LAB_0039ce3b:
        lVar37 = *(long *)((long)puVar39 + 1);
        uVar36 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f);
        uVar41 = (ulong)(lVar37 * -0x30e44323485a9b9d) >> (0x38 - bVar26 & 0x3f);
        puVar35 = (ulong *)((long)puVar39 + 1);
        uVar21 = pUVar14[uVar36];
        uVar32 = (ulong)uVar21;
        uVar57 = pUVar12[uVar41 >> 8];
        pUVar14[uVar36] = UVar30;
        if (uVar17 < uVar21) {
          plVar34 = (long *)(pBVar9 + uVar32);
          if (*plVar34 != lVar37) goto LAB_0039d08a;
          puVar33 = (ulong *)((long)puVar39 + 9);
          puVar43 = (ulong *)(plVar34 + 1);
          puVar42 = puVar33;
          if (puVar33 < puVar1) {
            if (*puVar43 == *puVar33) {
              lVar37 = 0;
              do {
                puVar43 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                if (puVar1 <= puVar43) {
                  puVar43 = (ulong *)(pBVar9 + lVar37 + uVar32 + 0x10);
                  puVar42 = (ulong *)((long)puVar39 + lVar37 + 0x11);
                  goto LAB_0039d368;
                }
                lVar38 = lVar37 + uVar32 + 0x10;
                uVar41 = *puVar43;
                lVar37 = lVar37 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar41);
              uVar41 = uVar41 ^ *(ulong *)(pBVar9 + lVar38);
              uVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar41 = (uVar36 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar36 = *puVar33 ^ *puVar43;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = uVar41 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0039d368:
            if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar43 = (ulong *)((long)puVar43 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar43 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar43 = (ulong *)((long)puVar43 + 2);
            }
            if (puVar42 < iEnd) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar33;
          }
          lVar37 = uVar41 + 8;
          UVar30 = (int)puVar35 - (int)plVar34;
          if (puVar35 <= src) goto LAB_0039d3fe;
          piVar60 = (int *)(pBVar9 + (uVar32 - 1));
          do {
            if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039d3f8;
            lVar37 = lVar37 + 1;
            puVar35 = (ulong *)((long)puVar39 + -1);
          } while ((src < puVar39) &&
                  (bVar16 = iStart < piVar60, piVar60 = (int *)((long)piVar60 + -1),
                  puVar39 = puVar35, bVar16));
          goto LAB_0039d3f3;
        }
        if ((char)uVar41 == (char)uVar57) {
          uVar57 = uVar57 >> 8;
          if ((uVar57 <= uVar7) || (*(long *)(pBVar11 + uVar57) != lVar37)) goto LAB_0039d08a;
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 9),(BYTE *)((long)(pBVar11 + uVar57) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar37 = sVar24 + 8;
          UVar30 = UVar30 - (uVar45 + uVar57);
          if (src < puVar35) {
            piVar60 = (int *)(pBVar11 + ((ulong)uVar57 - 1));
            do {
              if ((BYTE)*puVar39 != (BYTE)*piVar60) goto LAB_0039d3f8;
              lVar37 = lVar37 + 1;
              puVar35 = (ulong *)((long)puVar39 + -1);
            } while ((src < puVar39) &&
                    (bVar16 = piVar40 < piVar60, puVar39 = puVar35,
                    piVar60 = (int *)((long)piVar60 + -1), bVar16));
            goto LAB_0039d3f3;
          }
        }
        else {
LAB_0039d08a:
          puVar35 = (ulong *)((long)puVar39 + 4);
          puVar33 = (ulong *)(piVar60 + 1);
          if (uVar59 < uVar17) {
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)puVar35,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            lVar37 = sVar24 + 4;
            UVar30 = UVar56 - uVar59;
            puVar35 = puVar39;
            if ((src < puVar39) && (piVar40 < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039d3f8;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, piVar40 < piVar60));
              goto LAB_0039d3f3;
            }
          }
          else {
            puVar43 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar33 == *puVar35) {
                lVar37 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)((long)piVar60 + lVar37 + 0xc);
                    puVar43 = (ulong *)((long)puVar39 + lVar37 + 0xc);
                    goto LAB_0039d2ba;
                  }
                  uVar32 = *(ulong *)((long)piVar60 + lVar37 + 0xc);
                  uVar41 = *puVar33;
                  lVar37 = lVar37 + 8;
                } while (uVar32 == uVar41);
                uVar41 = uVar41 ^ uVar32;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar37;
              }
              else {
                uVar41 = *puVar35 ^ *puVar33;
                uVar32 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0039d2ba:
              if ((puVar43 < puVar2) && ((int)*puVar33 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar33 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar43 < iEnd) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar43));
              }
              uVar32 = (long)puVar43 - (long)puVar35;
            }
            lVar37 = uVar32 + 4;
            UVar30 = iVar50 - (int)piVar60;
            puVar35 = puVar39;
            if ((src < puVar39) && (iStart < piVar60)) {
              puVar39 = (ulong *)((long)puVar39 + -1);
              do {
                piVar60 = (int *)((long)piVar60 + -1);
                if ((BYTE)*puVar39 != *(BYTE *)piVar60) goto LAB_0039d3f8;
                lVar37 = lVar37 + 1;
                puVar35 = (ulong *)((long)puVar39 + -1);
              } while ((src < puVar39) && (puVar39 = puVar35, iStart < piVar60));
LAB_0039d3f3:
              puVar35 = (ulong *)((long)puVar35 + 1);
            }
          }
        }
        goto LAB_0039d3fe;
      }
      if ((char)uVar54 == (char)uVar57) {
        uVar57 = uVar57 >> 8;
        if ((uVar7 < uVar57) && (*(int *)(pBVar11 + uVar57) == (int)*puVar39)) {
          uVar59 = uVar57 + uVar45;
          piVar60 = (int *)(pBVar11 + uVar57);
          goto LAB_0039ce3b;
        }
      }
LAB_0039cf5c:
      puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      goto LAB_0039d6c2;
    }
  }
LAB_0039d6e2:
  *rep = local_144;
  rep[1] = UVar58;
  return (long)iEnd - (long)src;
LAB_0039c749:
  puVar35 = (ulong *)((long)puVar39 + 1);
LAB_0039c754:
  uVar32 = (long)puVar35 - (long)src;
  puVar39 = (ulong *)seqStore->lit;
  if (puVar23 < puVar35) {
    ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
  }
  else {
    uVar41 = *(ulong *)((long)src + 8);
    *puVar39 = *src;
    puVar39[1] = uVar41;
    pBVar44 = seqStore->lit;
    if (uVar32 < 0x11) {
      seqStore->lit = pBVar44 + uVar32;
      psVar25 = seqStore->sequences;
      goto LAB_0039c800;
    }
    uVar41 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar44 + 0x18) = uVar41;
    if (0x20 < (long)uVar32) {
      lVar38 = 0;
      do {
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x20);
        uVar18 = puVar6[1];
        pBVar4 = pBVar44 + lVar38 + 0x20;
        *(undefined8 *)pBVar4 = *puVar6;
        *(undefined8 *)(pBVar4 + 8) = uVar18;
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x30);
        uVar18 = puVar6[1];
        *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
        *(undefined8 *)(pBVar4 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar4 + 0x20 < pBVar44 + uVar32);
    }
  }
  seqStore->lit = seqStore->lit + uVar32;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0039c800:
  psVar25->litLength = (U16)uVar32;
  psVar25->offBase = UVar30 + 3;
  uVar32 = lVar37 - 3;
  UVar58 = local_144;
joined_r0x0039c48b:
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  puVar39 = (ulong *)(lVar37 + (long)puVar35);
  psVar25->mlBase = (U16)uVar32;
  seqStore->sequences = psVar25 + 1;
  src = puVar39;
  local_144 = UVar30;
  if (puVar39 <= puVar5) {
    uVar21 = UVar56 + 2;
    lVar37 = *(long *)(pBVar9 + uVar21);
    pUVar14[(ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar21;
    pUVar14[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar39 + -2) - iVar47;
    pUVar15[(ulong)(lVar37 * -0x30e4432345000000) >> (bVar29 & 0x3f)] = uVar21;
    pUVar15[(ulong)(*(long *)((long)puVar39 + -1) * -0x30e4432345000000) >> (bVar29 & 0x3f)] =
         ((int)puVar39 + -1) - iVar47;
    UVar56 = UVar58;
    do {
      UVar22 = UVar30;
      UVar30 = (int)puVar39 - iVar47;
      uVar21 = UVar30 - UVar56;
      pBVar44 = pBVar9;
      if (uVar21 < uVar17) {
        pBVar44 = pBVar11 + -uVar46;
      }
      src = puVar39;
      UVar58 = UVar56;
      local_144 = UVar22;
      if (((uVar17 - 1) - uVar21 < 3) || (*(int *)(pBVar44 + uVar21) != (int)*puVar39)) break;
      puVar35 = iEnd;
      if (uVar21 < uVar17) {
        puVar35 = mEnd;
      }
      sVar24 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar44 + uVar21) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar35,(BYTE *)iStart);
      puVar35 = (ulong *)seqStore->lit;
      if (puVar23 < puVar39) {
        ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar23);
      }
      else {
        uVar32 = puVar39[1];
        *puVar35 = *puVar39;
        puVar35[1] = uVar32;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (0xffff < sVar24 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar24 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar32 = *puVar39;
      pUVar15[uVar32 * -0x30e4432345000000 >> (bVar29 & 0x3f)] = UVar30;
      pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
      puVar39 = (ulong *)((long)puVar39 + sVar24 + 4);
      src = puVar39;
      UVar58 = UVar22;
      local_144 = UVar56;
      UVar30 = UVar56;
      UVar56 = UVar22;
    } while (puVar39 <= puVar5);
  }
LAB_0039ca26:
  if (puVar5 <= puVar39) goto LAB_0039d6e2;
  goto LAB_0039bea1;
LAB_0039ba89:
  puVar35 = (ulong *)((long)puVar39 + 1);
LAB_0039ba8f:
  uVar32 = (long)puVar35 - (long)src;
  puVar39 = (ulong *)seqStore->lit;
  if (puVar23 < puVar35) {
    ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
  }
  else {
    uVar41 = *(ulong *)((long)src + 8);
    *puVar39 = *src;
    puVar39[1] = uVar41;
    pBVar44 = seqStore->lit;
    if (uVar32 < 0x11) {
      seqStore->lit = pBVar44 + uVar32;
      psVar25 = seqStore->sequences;
      goto LAB_0039bb41;
    }
    uVar41 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar44 + 0x18) = uVar41;
    if (0x20 < (long)uVar32) {
      lVar38 = 0;
      do {
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x20);
        uVar18 = puVar6[1];
        pBVar4 = pBVar44 + lVar38 + 0x20;
        *(undefined8 *)pBVar4 = *puVar6;
        *(undefined8 *)(pBVar4 + 8) = uVar18;
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x30);
        uVar18 = puVar6[1];
        *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
        *(undefined8 *)(pBVar4 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar4 + 0x20 < pBVar44 + uVar32);
    }
  }
  seqStore->lit = seqStore->lit + uVar32;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0039bb41:
  psVar25->litLength = (U16)uVar32;
  psVar25->offBase = UVar30 + 3;
  uVar32 = lVar37 - 3;
  UVar58 = local_144;
joined_r0x0039b7dc:
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  puVar39 = (ulong *)(lVar37 + (long)puVar35);
  psVar25->mlBase = (U16)uVar32;
  seqStore->sequences = psVar25 + 1;
  src = puVar39;
  local_144 = UVar30;
  if (puVar39 <= puVar5) {
    uVar21 = UVar56 + 2;
    lVar37 = *(long *)(pBVar9 + uVar21);
    pUVar14[(ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar21;
    pUVar14[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar39 + -2) - iVar47;
    pUVar15[(ulong)(lVar37 * -0x30e4432340650000) >> (bVar29 & 0x3f)] = uVar21;
    pUVar15[(ulong)(*(long *)((long)puVar39 + -1) * -0x30e4432340650000) >> (bVar29 & 0x3f)] =
         ((int)puVar39 + -1) - iVar47;
    UVar56 = UVar58;
    do {
      UVar22 = UVar30;
      UVar30 = (int)puVar39 - iVar47;
      uVar21 = UVar30 - UVar56;
      pBVar44 = pBVar9;
      if (uVar21 < uVar17) {
        pBVar44 = pBVar11 + -uVar46;
      }
      src = puVar39;
      UVar58 = UVar56;
      local_144 = UVar22;
      if (((uVar17 - 1) - uVar21 < 3) || (*(int *)(pBVar44 + uVar21) != (int)*puVar39)) break;
      puVar35 = iEnd;
      if (uVar21 < uVar17) {
        puVar35 = mEnd;
      }
      sVar24 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar44 + uVar21) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar35,(BYTE *)iStart);
      puVar35 = (ulong *)seqStore->lit;
      if (puVar23 < puVar39) {
        ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar23);
      }
      else {
        uVar32 = puVar39[1];
        *puVar35 = *puVar39;
        puVar35[1] = uVar32;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (0xffff < sVar24 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar24 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar32 = *puVar39;
      pUVar15[uVar32 * -0x30e4432340650000 >> (bVar29 & 0x3f)] = UVar30;
      pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
      puVar39 = (ulong *)((long)puVar39 + sVar24 + 4);
      src = puVar39;
      UVar58 = UVar22;
      local_144 = UVar56;
      UVar30 = UVar56;
      UVar56 = UVar22;
    } while (puVar39 <= puVar5);
  }
LAB_0039bd67:
  if (puVar5 <= puVar39) goto LAB_0039d6e2;
  goto LAB_0039b1f2;
LAB_0039d3f8:
  puVar35 = (ulong *)((long)puVar39 + 1);
LAB_0039d3fe:
  uVar32 = (long)puVar35 - (long)src;
  puVar39 = (ulong *)seqStore->lit;
  if (puVar23 < puVar35) {
    ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
  }
  else {
    uVar41 = *(ulong *)((long)src + 8);
    *puVar39 = *src;
    puVar39[1] = uVar41;
    pBVar44 = seqStore->lit;
    if (uVar32 < 0x11) {
      seqStore->lit = pBVar44 + uVar32;
      psVar25 = seqStore->sequences;
      goto LAB_0039d4b5;
    }
    uVar41 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar44 + 0x18) = uVar41;
    if (0x20 < (long)uVar32) {
      lVar38 = 0;
      do {
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x20);
        uVar18 = puVar6[1];
        pBVar4 = pBVar44 + lVar38 + 0x20;
        *(undefined8 *)pBVar4 = *puVar6;
        *(undefined8 *)(pBVar4 + 8) = uVar18;
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x30);
        uVar18 = puVar6[1];
        *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
        *(undefined8 *)(pBVar4 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar4 + 0x20 < pBVar44 + uVar32);
    }
  }
  seqStore->lit = seqStore->lit + uVar32;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0039d4b5:
  psVar25->litLength = (U16)uVar32;
  psVar25->offBase = UVar30 + 3;
  uVar32 = lVar37 - 3;
  UVar58 = local_144;
joined_r0x0039d14c:
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar37 + (long)puVar35);
  psVar25->mlBase = (U16)uVar32;
  seqStore->sequences = psVar25 + 1;
  puVar39 = (ulong *)src;
  local_144 = UVar30;
  if (src <= puVar5) {
    uVar21 = UVar56 + 2;
    pUVar14[(ulong)(*(long *)(pBVar9 + uVar21) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar21;
    pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)src + -2) - iVar47;
    pUVar15[(uint)(*(int *)(pBVar9 + uVar21) * -0x61c8864f) >> (bVar29 & 0x1f)] = uVar21;
    pUVar15[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar29 & 0x1f)] =
         ((int)src + -1) - iVar47;
    UVar56 = UVar58;
    do {
      UVar22 = UVar30;
      UVar30 = (int)src - iVar47;
      uVar21 = UVar30 - UVar56;
      pBVar44 = pBVar9;
      if (uVar21 < uVar17) {
        pBVar44 = pBVar11 + -uVar46;
      }
      puVar39 = (ulong *)src;
      UVar58 = UVar56;
      local_144 = UVar22;
      if (((uVar17 - 1) - uVar21 < 3) || (*(int *)(pBVar44 + uVar21) != (int)*src)) break;
      puVar39 = iEnd;
      if (uVar21 < uVar17) {
        puVar39 = mEnd;
      }
      sVar24 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar44 + uVar21) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar39,(BYTE *)iStart);
      puVar39 = (ulong *)seqStore->lit;
      if (puVar23 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)src,(BYTE *)puVar23);
      }
      else {
        uVar32 = *(ulong *)((long)src + 8);
        *puVar39 = *src;
        puVar39[1] = uVar32;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (0xffff < sVar24 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar24 + 1);
      seqStore->sequences = psVar25 + 1;
      pUVar15[(uint)((int)*src * -0x61c8864f) >> (bVar29 & 0x1f)] = UVar30;
      pUVar14[*src * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
      src = (void *)((long)src + sVar24 + 4);
      puVar39 = (ulong *)src;
      UVar58 = UVar22;
      local_144 = UVar56;
      UVar30 = UVar56;
      UVar56 = UVar22;
    } while (src <= puVar5);
  }
LAB_0039d6c2:
  if (puVar5 <= puVar39) goto LAB_0039d6e2;
  goto LAB_0039cb5c;
LAB_0039add8:
  puVar35 = (ulong *)((long)puVar39 + 1);
LAB_0039adde:
  uVar32 = (long)puVar35 - (long)src;
  puVar39 = (ulong *)seqStore->lit;
  if (puVar23 < puVar35) {
    ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar35,(BYTE *)puVar23);
  }
  else {
    uVar41 = *(ulong *)((long)src + 8);
    *puVar39 = *src;
    puVar39[1] = uVar41;
    pBVar44 = seqStore->lit;
    if (uVar32 < 0x11) {
      seqStore->lit = pBVar44 + uVar32;
      psVar25 = seqStore->sequences;
      goto LAB_0039ae90;
    }
    uVar41 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar44 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar44 + 0x18) = uVar41;
    if (0x20 < (long)uVar32) {
      lVar38 = 0;
      do {
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x20);
        uVar18 = puVar6[1];
        pBVar4 = pBVar44 + lVar38 + 0x20;
        *(undefined8 *)pBVar4 = *puVar6;
        *(undefined8 *)(pBVar4 + 8) = uVar18;
        puVar6 = (undefined8 *)((long)src + lVar38 + 0x30);
        uVar18 = puVar6[1];
        *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
        *(undefined8 *)(pBVar4 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar4 + 0x20 < pBVar44 + uVar32);
    }
  }
  seqStore->lit = seqStore->lit + uVar32;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0039ae90:
  psVar25->litLength = (U16)uVar32;
  psVar25->offBase = UVar30 + 3;
  uVar32 = lVar37 - 3;
  UVar58 = local_144;
joined_r0x0039ab2b:
  if (0xffff < uVar32) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  puVar39 = (ulong *)(lVar37 + (long)puVar35);
  psVar25->mlBase = (U16)uVar32;
  seqStore->sequences = psVar25 + 1;
  src = puVar39;
  local_144 = UVar30;
  if (puVar39 <= puVar5) {
    uVar21 = UVar56 + 2;
    lVar37 = *(long *)(pBVar9 + uVar21);
    pUVar14[(ulong)(lVar37 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar21;
    pUVar14[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar39 + -2) - iVar47;
    pUVar15[(ulong)(lVar37 * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] = uVar21;
    pUVar15[(ulong)(*(long *)((long)puVar39 + -1) * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] =
         ((int)puVar39 + -1) - iVar47;
    UVar56 = UVar58;
    do {
      UVar22 = UVar30;
      UVar30 = (int)puVar39 - iVar47;
      uVar21 = UVar30 - UVar56;
      pBVar44 = pBVar9;
      if (uVar21 < uVar17) {
        pBVar44 = pBVar11 + -uVar46;
      }
      src = puVar39;
      UVar58 = UVar56;
      local_144 = UVar22;
      if (((uVar17 - 1) - uVar21 < 3) || (*(int *)(pBVar44 + uVar21) != (int)*puVar39)) break;
      puVar35 = iEnd;
      if (uVar21 < uVar17) {
        puVar35 = mEnd;
      }
      sVar24 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar44 + uVar21) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar35,(BYTE *)iStart);
      puVar35 = (ulong *)seqStore->lit;
      if (puVar23 < puVar39) {
        ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar23);
      }
      else {
        uVar32 = puVar39[1];
        *puVar35 = *puVar39;
        puVar35[1] = uVar32;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (0xffff < sVar24 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar24 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar32 = *puVar39;
      pUVar15[uVar32 * -0x30e44323405a9d00 >> (bVar29 & 0x3f)] = UVar30;
      pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
      puVar39 = (ulong *)((long)puVar39 + sVar24 + 4);
      src = puVar39;
      UVar58 = UVar22;
      local_144 = UVar56;
      UVar30 = UVar56;
      UVar56 = UVar22;
    } while (puVar39 <= puVar5);
  }
LAB_0039b0b6:
  if (puVar5 <= puVar39) goto LAB_0039d6e2;
  goto LAB_0039a541;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}